

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.cpp
# Opt level: O0

bool __thiscall gui::TRect::ClipStraightLine(TRect *this,TPoint *a,TPoint *b)

{
  uint uVar1;
  uint uVar2;
  int r1;
  int r0;
  TPoint *b_local;
  TPoint *a_local;
  TRect *this_local;
  
  uVar1 = GetRegion(this,*a);
  uVar2 = GetRegion(this,*b);
  if (uVar1 == 0 && uVar2 == 0) {
    this_local._7_1_ = true;
  }
  else if ((uVar1 & uVar2) == 0) {
    if (a->x < (this->p0).x) {
      a->x = (this->p0).x;
    }
    if (a->y < (this->p0).y) {
      a->y = (this->p0).y;
    }
    if ((this->p1).x < b->x) {
      b->x = (this->p1).x;
    }
    if ((this->p1).y <= b->y) {
      b->y = (this->p1).y;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TRect::ClipStraightLine(TPoint &a, TPoint &b) const {
    int r0 = GetRegion(a);
    int r1 = GetRegion(b);

    // Line is in bound
    if (!(r0 | r1)) {
        return true;
    }

    // Line is invisible
    if (r0 & r1) {
        return false;
    }

    // Clip the line
    if (a.x < p0.x) {
        a.x = p0.x;
    }

    if (a.y < p0.y) {
        a.y = p0.y;
    }

    if (b.x > p1.x) {
        b.x = p1.x;
    }

    if (b.y >= p1.y) {
        b.y = p1.y;
    }

    return true;
}